

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_cost_enc.c
# Opt level: O1

void ConvertPopulationCountTableToBitEstimates
               (int num_symbols,uint32_t *population_counts,double *output)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  float fVar5;
  float fVar6;
  
  if (num_symbols < 1) {
    uVar3 = 0;
    bVar4 = true;
  }
  else {
    uVar1 = 0;
    uVar3 = 0;
    uVar2 = 0;
    do {
      uVar3 = uVar3 + population_counts[uVar1];
      uVar2 = (uVar2 + 1) - (uint)(population_counts[uVar1] == 0);
      uVar1 = uVar1 + 1;
    } while ((uint)num_symbols != uVar1);
    bVar4 = uVar2 < 2;
  }
  if (bVar4) {
    memset(output,0,(long)num_symbols << 3);
    return;
  }
  if (uVar3 < 0x100) {
    fVar5 = kLog2Table[uVar3];
  }
  else {
    fVar5 = (*VP8LFastLog2Slow)(uVar3);
  }
  if (0 < num_symbols) {
    uVar1 = 0;
    do {
      uVar3 = population_counts[uVar1];
      if ((ulong)uVar3 < 0x100) {
        fVar6 = kLog2Table[uVar3];
      }
      else {
        fVar6 = (*VP8LFastLog2Slow)(uVar3);
      }
      output[uVar1] = (double)fVar5 - (double)fVar6;
      uVar1 = uVar1 + 1;
    } while ((uint)num_symbols != uVar1);
  }
  return;
}

Assistant:

static void ConvertPopulationCountTableToBitEstimates(
    int num_symbols, const uint32_t population_counts[], double output[]) {
  uint32_t sum = 0;
  int nonzeros = 0;
  int i;
  for (i = 0; i < num_symbols; ++i) {
    sum += population_counts[i];
    if (population_counts[i] > 0) {
      ++nonzeros;
    }
  }
  if (nonzeros <= 1) {
    memset(output, 0, num_symbols * sizeof(*output));
  } else {
    const double logsum = VP8LFastLog2(sum);
    for (i = 0; i < num_symbols; ++i) {
      output[i] = logsum - VP8LFastLog2(population_counts[i]);
    }
  }
}